

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate_const&>
          (QMovableArrayOps<QSslCertificate> *this,qsizetype i,QSslCertificate *args)

{
  QSslCertificate **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QSslCertificate QVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QSslCertificate tmp;
  Inserter local_58;
  QSslCertificate local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.
           d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0010ab66:
    local_30.d.d.ptr = (QExplicitlySharedDataPointer<QSslCertificatePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QSslCertificate::QSslCertificate(&local_30,args);
    bVar6 = (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>
            .size != 0;
    QArrayDataPointer<QSslCertificate>::detachAndGrow
              ((QArrayDataPointer<QSslCertificate> *)this,(uint)(i == 0 && bVar6),1,
               (QSslCertificate **)0x0,(QArrayDataPointer<QSslCertificate> *)0x0);
    QVar5.d.d.ptr = local_30.d.d.ptr;
    if (i == 0 && bVar6) {
      local_30.d.d.ptr =
           (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
           (totally_ordered_wrapper<QSslCertificatePrivate_*>)0x0;
      (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.ptr
      [-1].d.d.ptr = (QSslCertificatePrivate *)QVar5.d.d.ptr;
      ppQVar1 = &(this->super_QGenericArrayOps<QSslCertificate>).
                 super_QArrayDataPointer<QSslCertificate>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QSslCertificate>).
                super_QArrayDataPointer<QSslCertificate>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_58.displaceTo =
           (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.
           ptr;
      local_58.displaceFrom = local_58.displaceTo + i;
      local_58.displaceTo = local_58.displaceTo + i + 1;
      local_58.nInserts = 1;
      local_58.bytes =
           ((this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>
            .size - i) * 8;
      local_58.data = (QArrayDataPointer<QSslCertificate> *)this;
      memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
      QVar5.d.d.ptr = local_30.d.d.ptr;
      local_30.d.d.ptr =
           (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
           (totally_ordered_wrapper<QSslCertificatePrivate_*>)0x0;
      ((local_58.displaceFrom)->d).d.ptr = (QSslCertificatePrivate *)QVar5.d.d.ptr;
      local_58.displaceFrom = local_58.displaceFrom + 1;
      Inserter::~Inserter(&local_58);
    }
    QSslCertificate::~QSslCertificate(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>
            .size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QSslCertificate>).
                      super_QArrayDataPointer<QSslCertificate>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QSslCertificate::QSslCertificate
                ((this->super_QGenericArrayOps<QSslCertificate>).
                 super_QArrayDataPointer<QSslCertificate>.ptr + lVar4,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QSslCertificate *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.
          ptr)) goto LAB_0010ab66;
      QSslCertificate::QSslCertificate
                ((this->super_QGenericArrayOps<QSslCertificate>).
                 super_QArrayDataPointer<QSslCertificate>.ptr + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QSslCertificate>).
                 super_QArrayDataPointer<QSslCertificate>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QSslCertificate>).
              super_QArrayDataPointer<QSslCertificate>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }